

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O0

BitMatrix * ZXing::ToBitMatrix<ZXing::Trit>(Matrix<ZXing::Trit> *in,Trit trueValue)

{
  bool bVar1;
  int iVar2;
  Matrix<ZXing::Trit> *in_RSI;
  BitMatrix *in_RDI;
  int x;
  int y;
  BitMatrix *out;
  uint in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 uVar3;
  BitMatrix *in_stack_ffffffffffffffa0;
  int local_30;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int iVar5;
  uint3 in_stack_ffffffffffffffe4;
  uint uVar6;
  Trit local_9 [9];
  
  uVar6 = (uint)in_stack_ffffffffffffffe4;
  Matrix<ZXing::Trit>::width(in_RSI);
  Matrix<ZXing::Trit>::height(in_RSI);
  BitMatrix::BitMatrix
            ((BitMatrix *)CONCAT44(uVar6,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
             in_stack_ffffffffffffffd8);
  iVar4 = 0;
  while (iVar5 = iVar4, iVar2 = Matrix<ZXing::Trit>::height(in_RSI), iVar4 < iVar2) {
    for (local_30 = 0; iVar4 = Matrix<ZXing::Trit>::width(in_RSI), local_30 < iVar4;
        local_30 = local_30 + 1) {
      in_stack_ffffffffffffffa0 =
           (BitMatrix *)
           Matrix<ZXing::Trit>::get
                     ((Matrix<ZXing::Trit> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                      in_stack_ffffffffffffff98);
      bVar1 = Trit::operator_cast_to_bool((Trit *)in_stack_ffffffffffffffa0);
      uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c);
      in_stack_ffffffffffffff98 = (uint)bVar1;
      bVar1 = Trit::operator_cast_to_bool(local_9);
      in_stack_ffffffffffffff9c = CONCAT13((char)((uint)uVar3 >> 0x18),CONCAT12(bVar1,(short)uVar3))
      ;
      if (in_stack_ffffffffffffff98 == bVar1) {
        BitMatrix::set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                       ,false);
      }
    }
    iVar4 = iVar5 + 1;
  }
  return in_RDI;
}

Assistant:

BitMatrix ToBitMatrix(const Matrix<T>& in, T trueValue = {true})
{
	BitMatrix out(in.width(), in.height());
	for (int y = 0; y < in.height(); ++y)
		for (int x = 0; x < in.width(); ++x)
			if (in.get(x, y) == trueValue)
				out.set(x, y);
	return out;
}